

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall solitaire::graphics::Renderer::renderFoundationPile(Renderer *this,PileId *id)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  const_reference card;
  PileId local_3c;
  Position local_38;
  PileId local_30;
  Position local_2c;
  PileId local_24;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *local_20;
  Cards *pileCards;
  PileId *id_local;
  Renderer *this_local;
  
  pileCards = (Cards *)id;
  id_local = (PileId *)this;
  iVar2 = (*this->context->_vptr_Context[5])();
  piles::PileId::PileId(&local_24,id);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x68))
                             ((long *)CONCAT44(extraout_var,iVar2),&local_24);
  local_20 = (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (**(code **)(*plVar3 + 0x30))();
  bVar1 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                    (local_20);
  if (bVar1) {
    piles::PileId::PileId(&local_30,id);
    local_2c = getFoundationPilePosition(this,&local_30);
    renderCardPlaceholder(this,&local_2c);
  }
  else {
    piles::PileId::PileId(&local_3c,id);
    local_38 = getFoundationPilePosition(this,&local_3c);
    card = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::back
                     (local_20);
    renderCard(this,&local_38,card);
  }
  return;
}

Assistant:

void Renderer::renderFoundationPile(const PileId id) const {
    const auto& pileCards = context.getSolitaire().getFoundationPile(id).getCards();

    if (pileCards.empty())
        renderCardPlaceholder(getFoundationPilePosition(id));
    else
        renderCard(getFoundationPilePosition(id), pileCards.back());
}